

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_hud.cpp
# Opt level: O1

void DrawImageToBox(FTexture *tex,int x,int y,int w,int h,int trans)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  if (tex != (FTexture *)0x0) {
    dVar2 = (double)tex->Width / (tex->Scale).X;
    dVar3 = (double)tex->Height / (tex->Scale).Y;
    uVar1 = -(ulong)((double)w < dVar2);
    dVar4 = (double)(~uVar1 & 0x3ff0000000000000 | (ulong)((double)w / dVar2) & uVar1);
    uVar1 = -(ulong)((double)h < dVar3);
    dVar5 = (double)(~uVar1 & 0x3ff0000000000000 | (ulong)((double)h / dVar3) & uVar1);
    if (dVar4 <= dVar5) {
      dVar5 = dVar4;
    }
    DCanvas::DrawTexture
              ((DCanvas *)screen,tex,(double)(int)(((uint)w >> 1) + x),(double)(y + h),0x400013a8,1,
               0x40001399,(ulong)(uint)hudwidth,0x4000139a,(ulong)(uint)hudheight,0x4000138b,
               (ulong)(uint)trans,0x40001389,(ulong)(uint)(int)(dVar2 * dVar5),0x4000138a,
               (ulong)(uint)(int)(dVar5 * dVar3),0x4000139e,1,0);
  }
  return;
}

Assistant:

static void DrawImageToBox(FTexture * tex, int x, int y, int w, int h, int trans=0xc000)
{
	double scale1, scale2;

	if (tex)
	{
		double texwidth=tex->GetScaledWidthDouble();
		double texheight=tex->GetScaledHeightDouble();

		if (w<texwidth) scale1=w/texwidth;
		else scale1=1.0f;
		if (h<texheight) scale2=h/texheight;
		else scale2=1.0f;
		if (scale2<scale1) scale1=scale2;

		x+=w>>1;
		y+=h;

		w=(int)(texwidth*scale1);
		h=(int)(texheight*scale1);

		screen->DrawTexture(tex, x, y,
			DTA_KeepRatio, true,
			DTA_VirtualWidth, hudwidth, DTA_VirtualHeight, hudheight, DTA_Alpha, trans, 
			DTA_DestWidth, w, DTA_DestHeight, h, DTA_CenterBottomOffset, 1, TAG_DONE);

	}
}